

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_beta_decode_int(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *out_size;
  if ((c->field_6).external.type == 0) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        *(int *)(out + uVar3 * 4) = -(c->field_6).huffman.ncodes;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      uVar2 = get_bits_MSB(in,(c->field_6).beta.nbits);
      *(uint *)(out + uVar3 * 4) = uVar2 - (c->field_6).huffman.ncodes;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return 0;
}

Assistant:

int cram_beta_decode_int(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = -c->beta.offset;
    }

    return 0;
}